

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupLevelized(Aig_Man_t *p)

{
  Aig_Man_t *p_00;
  char *pcVar1;
  Vec_Int_t *pVVar2;
  Aig_Obj_t **ppAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Vec_Vec_t *p_01;
  Vec_Ptr_t *pVVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *p1;
  Tim_Man_t *pTVar8;
  int iVar9;
  int iVar10;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar1;
  iVar9 = p->nConstrs;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = iVar9;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar2 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar2;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    ppAVar3 = (Aig_Obj_t **)calloc(1,(long)p->vObjs->nSize << 3);
    p_00->pEquivs = ppAVar3;
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    ppAVar3 = (Aig_Obj_t **)calloc(1,(long)p->vObjs->nSize << 3);
    p_00->pReprs = ppAVar3;
  }
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar9 = 0; iVar9 < p->vCis->nSize; iVar9 = iVar9 + 1) {
    pvVar4 = Vec_PtrEntry(p->vCis,iVar9);
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(ulong *)&pAVar5->field_0x18 =
         *(ulong *)&pAVar5->field_0x18 & 0xff000000ffffffff |
         *(ulong *)((long)pvVar4 + 0x18) & 0xffffff00000000;
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
  }
  p_01 = Aig_ManLevelize(p);
  for (iVar9 = 0; iVar10 = p_01->nSize, iVar9 < iVar10; iVar9 = iVar9 + 1) {
    iVar10 = 0;
    while( true ) {
      pVVar6 = Vec_VecEntry(p_01,iVar9);
      if (pVVar6->nSize <= iVar10) break;
      pVVar6 = Vec_VecEntry(p_01,iVar9);
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar6,iVar10);
      pAVar7 = Aig_ObjChild0Copy(pAVar5);
      p1 = Aig_ObjChild1Copy(pAVar5);
      pAVar7 = Aig_Oper(p_00,pAVar7,p1,*(Aig_Type_t *)&pAVar5->field_0x18 & AIG_OBJ_VOID);
      (pAVar5->field_5).pData = pAVar7;
      iVar10 = iVar10 + 1;
    }
  }
  for (iVar9 = 0; iVar9 < iVar10; iVar9 = iVar9 + 1) {
    pVVar6 = Vec_VecEntry(p_01,iVar9);
    if (pVVar6 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(pVVar6);
    }
    iVar10 = p_01->nSize;
  }
  Vec_PtrFree((Vec_Ptr_t *)p_01);
  for (iVar9 = 0; iVar9 < p->vCos->nSize; iVar9 = iVar9 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar9);
    pAVar7 = Aig_ObjChild0Copy(pAVar5);
    pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
    (pAVar5->field_5).pData = pAVar7;
  }
  if ((p->nObjs[4] == 0) && (p->nObjs[6] + p->nObjs[5] != p_00->nObjs[6] + p_00->nObjs[5])) {
    __assert_fail("Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                  ,0x32b,"Aig_Man_t *Aig_ManDupLevelized(Aig_Man_t *)");
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    pTVar8 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar8;
  }
  iVar9 = Aig_ManCheck(p_00);
  if (iVar9 == 0) {
    puts("Aig_ManDupLevelized(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupLevelized( Aig_Man_t * p )
{
    Vec_Vec_t * vLevels;
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
    {
        pNew->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    if ( p->pReprs )
    {
        pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    // duplicate internal nodes
    vLevels = Aig_ManLevelize( p );
    Vec_VecForEachEntry( Aig_Obj_t *, vLevels, pObj, i, k )
    {
        pObjNew = Aig_Oper( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj), Aig_ObjType(pObj) );
        pObj->pData = pObjNew;
    }
    Vec_VecFree( vLevels );
    // duplicate POs
    Aig_ManForEachCo( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
        pObj->pData = pObjNew;
    }
    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
//    if ( (nNodes = Aig_ManCleanup( pNew )) )
//        printf( "Aig_ManDupLevelized(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupLevelized(): The check has failed.\n" );
    return pNew;
}